

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

uint ptrlen_to_port_number(ptrlen input)

{
  char *pcVar1;
  char *end;
  char *p;
  uint val;
  ptrlen input_local;
  
  end = (char *)input.ptr;
  p._4_4_ = 0;
  pcVar1 = end + input.len;
  while( true ) {
    if (pcVar1 <= end) {
      return p._4_4_;
    }
    if ((*end < '0') || ('9' < *end)) break;
    p._4_4_ = p._4_4_ * 10 + *end + -0x30;
    if (0xffff < p._4_4_) {
      p._4_4_ = 0x10000;
    }
    end = end + 1;
  }
  __assert_fail("\'0\' <= *p && *p <= \'9\'",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                ,0x152,"unsigned int ptrlen_to_port_number(ptrlen)");
}

Assistant:

static unsigned ptrlen_to_port_number(ptrlen input)
{
    unsigned val = 0;
    for (const char *p = input.ptr, *end = p + input.len; p < end; p++) {
        assert('0' <= *p && *p <= '9'); /* expect parser to have checked */
        val = 10 * val + (*p - '0');
        if (val >= 65536)
            val = 65536; /* normalise 'too large' to avoid integer overflow */
    }
    return val;
}